

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Mix::doExpand
          (Mix *this,ExpandContext *param_1,ArgExprs *args_)

{
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<float> local_d8;
  ExprP<float> local_c8;
  ExprP<float> local_b8;
  ExprP<float> local_a8 [2];
  float local_84;
  ExprP<float> local_80;
  ExprP<float> local_70;
  ExprP<float> local_60;
  ExprP<float> local_50;
  ExprP<float> *local_40;
  ExprP<float> *a;
  ExprP<float> *y;
  ExprP<float> *x;
  ArgExprs *args__local;
  ExpandContext *param_1_local;
  Mix *this_local;
  
  a = in_RCX + 1;
  local_40 = in_RCX + 2;
  local_84 = 1.0;
  y = in_RCX;
  args__local = args_;
  param_1_local = param_1;
  this_local = this;
  constant<float>((BuiltinPrecisionTests *)&local_80,&local_84);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_70,&local_80,local_40);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_60,in_RCX,&local_70);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)local_a8,a,local_40);
  BuiltinPrecisionTests::operator+((BuiltinPrecisionTests *)&local_50,&local_60,local_a8);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_d8,a,y);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_c8,&local_d8,local_40);
  BuiltinPrecisionTests::operator+((BuiltinPrecisionTests *)&local_b8,y,&local_c8);
  alternatives<float>((BuiltinPrecisionTests *)this,&local_50,&local_b8);
  ExprP<float>::~ExprP(&local_b8);
  ExprP<float>::~ExprP(&local_c8);
  ExprP<float>::~ExprP(&local_d8);
  ExprP<float>::~ExprP(&local_50);
  ExprP<float>::~ExprP(local_a8);
  ExprP<float>::~ExprP(&local_60);
  ExprP<float>::~ExprP(&local_70);
  ExprP<float>::~ExprP(&local_80);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

static double step (double edge, double x)
{
	return x < edge ? 0.0 : 1.0;
}